

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

string * __thiscall
libchars::commands::value_abi_cxx11_(string *__return_storage_ptr__,commands *this)

{
  size_t sVar1;
  char *pcVar2;
  commands *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = edit_object::length(&this->super_edit_object);
  if ((sVar1 != 0) && (pcVar2 = edit_object::data(&this->super_edit_object), pcVar2 != (char *)0x0))
  {
    pcVar2 = edit_object::data(&this->super_edit_object);
    edit_object::length(&this->super_edit_object);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string commands::value() const
    {
        std::string str;
        if (length() > 0 && data() != NULL)
            str.assign(data(),length());
        return str;
    }